

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O2

DSeqNode * SN_CheckSequence(sector_t *sector,int chan)

{
  DSeqNode *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DSeqNode *this;
  
  pDVar1 = DSeqNode::SequenceListHead;
  while( true ) {
    do {
      this = pDVar1;
      if (this == (DSeqNode *)0x0) {
        return (DSeqNode *)0x0;
      }
      pDVar1 = this->m_Next;
      iVar3 = (*(this->super_DObject)._vptr_DObject[8])(this);
    } while ((sector_t *)CONCAT44(extraout_var,iVar3) != sector);
    bVar2 = DObject::IsKindOf(&this->super_DObject,DSeqSectorNode::RegistrationInfo.MyClass);
    if (!bVar2) break;
    if ((*(uint *)&this[1].super_DObject._vptr_DObject & 7) == chan) {
      return this;
    }
  }
  __assert_fail("node->IsKindOf(RUNTIME_CLASS(DSeqSectorNode))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sndseq.cpp"
                ,0x3e0,"DSeqNode *SN_CheckSequence(sector_t *, int)");
}

Assistant:

DSeqNode *SN_CheckSequence(sector_t *sector, int chan)
{
	for (DSeqNode *node = DSeqNode::FirstSequence(); node; )
	{
		DSeqNode *next = node->NextSequence();
		if (node->Source() == sector)
		{
			assert(node->IsKindOf(RUNTIME_CLASS(DSeqSectorNode)));
			if ((static_cast<DSeqSectorNode *>(node)->Channel & 7) == chan)
			{
				return node;
			}
		}
		node = next;
	}
	return NULL;
}